

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O3

void BrotliBuildMetaBlockGreedy
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,
               uint8_t prev_byte2,ContextLut literal_context_lut,size_t num_contexts,
               uint32_t *static_context_map,Command_conflict *commands,size_t n_commands,
               MetaBlockSplit *mb)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  size_t __n;
  undefined1 auVar8 [16];
  size_t sVar9;
  ulong uVar10;
  uint8_t *__dest;
  uint32_t *puVar11;
  HistogramLiteral *__s;
  Command_conflict *pCVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  anon_union_328_2_32013c24 lit_blocks;
  BlockSplitterDistance dist_blocks;
  BlockSplitterCommand cmd_blocks;
  HistogramCommand **in_stack_fffffffffffffd58;
  size_t *in_stack_fffffffffffffd60;
  ContextBlockSplitter local_268;
  BlockSplitterDistance local_120;
  BlockSplitterCommand local_a8;
  
  uVar17 = (ulong)prev_byte2;
  uVar15 = (ulong)prev_byte;
  if (num_contexts == 1) {
    sVar14 = 0;
    sVar9 = n_commands;
    pCVar12 = commands;
    if (n_commands != 0) {
      do {
        sVar14 = sVar14 + pCVar12->insert_len_;
        sVar9 = sVar9 - 1;
        pCVar12 = pCVar12 + 1;
      } while (sVar9 != 0);
    }
    InitBlockSplitterLiteral
              (m,(BlockSplitterLiteral *)&local_268,sVar14,(size_t)mb,
               (double)CONCAT44(in_XMM0_Db,in_XMM0_Da),(size_t)&mb->literal_histograms,
               (BlockSplit *)&mb->literal_histograms_size,
               (HistogramLiteral **)in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
    InitBlockSplitterCommand
              (m,&local_a8,n_commands,(size_t)&mb->command_split,
               (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),(size_t)&mb->command_histograms,
               (BlockSplit *)&mb->command_histograms_size,in_stack_fffffffffffffd58,
               in_stack_fffffffffffffd60);
    InitBlockSplitterDistance
              (m,&local_120,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
    if (n_commands != 0) {
      sVar9 = 0;
      do {
        uVar5 = commands[sVar9].insert_len_;
        uVar15 = (ulong)commands[sVar9].copy_len_;
        uVar3 = commands[sVar9].dist_prefix_;
        uVar4 = commands[sVar9].cmd_prefix_;
        BlockSplitterAddSymbolCommand(&local_a8,(ulong)uVar4);
        for (uVar17 = (ulong)uVar5; uVar17 != 0; uVar17 = uVar17 - 1) {
          BlockSplitterAddSymbolLiteral
                    ((BlockSplitterLiteral *)&local_268,(ulong)ringbuffer[pos & mask]);
          pos = pos + 1;
        }
        if (((uVar15 & 0x1ffffff) != 0) && (0x7f < uVar4)) {
          BlockSplitterAddSymbolDistance(&local_120,(ulong)(uVar3 & 0x3ff));
        }
        pos = pos + ((uint)uVar15 & 0x1ffffff);
        sVar9 = sVar9 + 1;
      } while (sVar9 != n_commands);
    }
    BlockSplitterFinishBlockLiteral((BlockSplitterLiteral *)&local_268,1);
    BlockSplitterFinishBlockCommand(&local_a8,1);
    BlockSplitterFinishBlockDistance(&local_120,1);
  }
  else {
    uVar18 = 0;
    pCVar12 = commands;
    sVar9 = n_commands;
    if (n_commands != 0) {
      do {
        uVar18 = uVar18 + pCVar12->insert_len_;
        sVar9 = sVar9 - 1;
        pCVar12 = pCVar12 + 1;
      } while (sVar9 != 0);
      uVar18 = uVar18 >> 9;
    }
    local_268.histograms_size_ = &mb->literal_histograms_size;
    uVar1 = uVar18 + 1;
    local_268.alphabet_size_ = 0x100;
    local_268.num_contexts_ = num_contexts;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = num_contexts;
    local_268.max_block_types_ = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x100)) / auVar8,0);
    local_268.min_block_size_ = 0x200;
    local_268.split_threshold_ = 400.0;
    local_268.num_blocks_ = 0;
    local_268.split_ = &mb->literal_split;
    local_268.target_block_size_ = 0x200;
    local_268.merge_last_count_ = 0;
    uVar10 = local_268.max_block_types_ + 1;
    if (uVar1 < local_268.max_block_types_ + 1) {
      uVar10 = uVar1;
    }
    local_268.block_size_ = 0;
    local_268.curr_histogram_ix_ = 0;
    uVar7 = (mb->literal_split).types_alloc_size;
    if (uVar7 <= uVar18) {
      if (uVar7 == 0) {
        uVar7 = uVar1;
      }
      do {
        uVar13 = uVar7;
        uVar7 = uVar13 * 2;
      } while (uVar13 <= uVar18);
      __dest = (uint8_t *)BrotliAllocate(m,uVar13);
      __n = (mb->literal_split).types_alloc_size;
      if (__n != 0) {
        memcpy(__dest,(mb->literal_split).types,__n);
      }
      BrotliFree(m,(mb->literal_split).types);
      (mb->literal_split).types = __dest;
      (mb->literal_split).types_alloc_size = uVar13;
    }
    uVar7 = (mb->literal_split).lengths_alloc_size;
    if (uVar7 <= uVar18) {
      if (uVar7 == 0) {
        uVar7 = uVar1;
      }
      do {
        uVar13 = uVar7;
        uVar7 = uVar13 * 2;
      } while (uVar13 <= uVar18);
      puVar11 = (uint32_t *)BrotliAllocate(m,uVar13 * 4);
      sVar9 = (mb->literal_split).lengths_alloc_size;
      if (sVar9 != 0) {
        memcpy(puVar11,(mb->literal_split).lengths,sVar9 << 2);
      }
      BrotliFree(m,(mb->literal_split).lengths);
      (mb->literal_split).lengths = puVar11;
      (mb->literal_split).lengths_alloc_size = uVar13;
    }
    (mb->literal_split).num_blocks = uVar1;
    sVar9 = uVar10 * num_contexts;
    mb->literal_histograms_size = sVar9;
    if (sVar9 == 0) {
      __s = (HistogramLiteral *)0x0;
    }
    else {
      __s = (HistogramLiteral *)BrotliAllocate(m,sVar9 * 0x410);
    }
    mb->literal_histograms = __s;
    lVar16 = num_contexts + (num_contexts == 0);
    local_268.histograms_ = __s;
    do {
      memset(__s,0,0x408);
      __s->bit_cost_ = INFINITY;
      __s = __s + 1;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
    local_268.last_histogram_ix_[0] = 0;
    local_268.last_histogram_ix_[1] = 0;
    InitBlockSplitterCommand
              (m,&local_a8,n_commands,(size_t)&mb->command_split,0.0,(size_t)&mb->command_histograms
               ,(BlockSplit *)&mb->command_histograms_size,in_stack_fffffffffffffd58,(size_t *)m);
    InitBlockSplitterDistance
              (m,&local_120,n_commands,(size_t)&mb->distance_split,
               (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01),
               (size_t)&mb->distance_histograms,(BlockSplit *)&mb->distance_histograms_size,
               (HistogramDistance **)in_stack_fffffffffffffd58,(size_t *)m);
    if (n_commands != 0) {
      sVar9 = 0;
      do {
        uVar5 = commands[sVar9].insert_len_;
        uVar6 = commands[sVar9].copy_len_;
        uVar3 = commands[sVar9].dist_prefix_;
        uVar4 = commands[sVar9].cmd_prefix_;
        BlockSplitterAddSymbolCommand(&local_a8,(ulong)uVar4);
        for (uVar18 = (ulong)uVar5; uVar18 != 0; uVar18 = uVar18 - 1) {
          bVar2 = ringbuffer[pos & mask];
          uVar5 = static_context_map
                  [literal_context_lut[uVar17 + 0x100] | literal_context_lut[uVar15]];
          local_268.histograms_[local_268.curr_histogram_ix_ + uVar5].data_[bVar2] =
               local_268.histograms_[local_268.curr_histogram_ix_ + uVar5].data_[bVar2] + 1;
          local_268.histograms_[local_268.curr_histogram_ix_ + uVar5].total_count_ =
               local_268.histograms_[local_268.curr_histogram_ix_ + uVar5].total_count_ + 1;
          local_268.block_size_ = local_268.block_size_ + 1;
          if (local_268.block_size_ == local_268.target_block_size_) {
            ContextBlockSplitterFinishBlock(&local_268,m,0);
          }
          pos = pos + 1;
          uVar17 = uVar15;
          uVar15 = (ulong)bVar2;
        }
        uVar18 = (ulong)(uVar6 & 0x1ffffff);
        pos = pos + uVar18;
        if (uVar18 != 0) {
          uVar17 = (ulong)ringbuffer[pos - 2 & mask];
          uVar15 = (ulong)ringbuffer[pos - 1 & mask];
          if (0x7f < uVar4) {
            BlockSplitterAddSymbolDistance(&local_120,(ulong)(uVar3 & 0x3ff));
          }
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != n_commands);
    }
    ContextBlockSplitterFinishBlock(&local_268,m,1);
    BlockSplitterFinishBlockCommand(&local_a8,1);
    BlockSplitterFinishBlockDistance(&local_120,1);
    sVar9 = (mb->literal_split).num_types;
    mb->literal_context_map_size = sVar9 << 6;
    if (sVar9 << 6 == 0) {
      puVar11 = (uint32_t *)0x0;
    }
    else {
      puVar11 = (uint32_t *)BrotliAllocate(m,sVar9 << 8);
      sVar9 = (mb->literal_split).num_types;
    }
    mb->literal_context_map = puVar11;
    if (sVar9 != 0) {
      sVar14 = 0;
      do {
        lVar16 = 0;
        do {
          puVar11[lVar16] = static_context_map[lVar16] + (int)sVar14 * (int)num_contexts;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x40);
        sVar14 = sVar14 + 1;
        puVar11 = puVar11 + 0x40;
      } while (sVar14 != sVar9);
    }
  }
  return;
}

Assistant:

void BrotliBuildMetaBlockGreedy(MemoryManager* m,
                                const uint8_t* ringbuffer,
                                size_t pos,
                                size_t mask,
                                uint8_t prev_byte,
                                uint8_t prev_byte2,
                                ContextLut literal_context_lut,
                                size_t num_contexts,
                                const uint32_t* static_context_map,
                                const Command* commands,
                                size_t n_commands,
                                MetaBlockSplit* mb) {
  if (num_contexts == 1) {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, 1, NULL, commands, n_commands, mb);
  } else {
    BrotliBuildMetaBlockGreedyInternal(m, ringbuffer, pos, mask, prev_byte,
        prev_byte2, literal_context_lut, num_contexts, static_context_map,
        commands, n_commands, mb);
  }
}